

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O0

RPCHelpMan * generatetodescriptor(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_fffffffffffff4f8;
  RPCArg *this;
  UniValue *in_stack_fffffffffffff500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff510;
  string *in_stack_fffffffffffff528;
  string *in_stack_fffffffffffff530;
  UniValue *in_stack_fffffffffffff538;
  iterator in_stack_fffffffffffff540;
  RPCArgOptions *in_stack_fffffffffffff548;
  string *in_stack_fffffffffffff550;
  undefined7 in_stack_fffffffffffff558;
  undefined1 in_stack_fffffffffffff55f;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff560;
  string *in_stack_fffffffffffff568;
  undefined1 *puVar2;
  RPCArg *in_stack_fffffffffffff570;
  RPCResults *in_stack_fffffffffffff578;
  RPCResult *in_stack_fffffffffffff580;
  RPCResults *pRVar3;
  pointer *local_a78;
  undefined7 in_stack_fffffffffffff640;
  undefined1 uVar4;
  RPCResults *args;
  string *description;
  undefined7 in_stack_fffffffffffff660;
  undefined1 uVar5;
  RPCHelpMan *this_00;
  allocator<char> local_93b;
  allocator<char> local_93a [2];
  pointer local_938;
  pointer pRStack_930;
  pointer local_928;
  allocator<char> local_912;
  allocator<char> local_911 [31];
  allocator<char> local_8f2;
  allocator<char> local_8f1 [30];
  allocator<char> local_8d3;
  allocator<char> local_8d2;
  allocator<char> local_8d1 [7];
  allocator<char> local_8ca;
  allocator<char> local_8c9;
  undefined4 local_8c8;
  allocator<char> local_8c1 [31];
  allocator<char> local_8a2;
  allocator<char> local_8a1;
  RPCMethodImpl *in_stack_fffffffffffff760;
  RPCResults local_7c0 [5];
  pointer local_738 [25];
  undefined1 local_670;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined1 local_630;
  undefined1 local_62f;
  undefined1 local_530;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined1 local_4f0;
  undefined1 local_4ef;
  undefined1 local_448;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined1 local_408;
  undefined1 local_407;
  undefined1 local_360 [528];
  RPCHelpMan local_150;
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff548,(char *)in_stack_fffffffffffff540,
             (allocator<char> *)in_stack_fffffffffffff538);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff548,(char *)in_stack_fffffffffffff540,
             (allocator<char> *)in_stack_fffffffffffff538);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff548,(char *)in_stack_fffffffffffff540,
             (allocator<char> *)in_stack_fffffffffffff538);
  local_8c8._0_1_ = '\0';
  local_8c8._1_3_ = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff508,&in_stack_fffffffffffff500->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff548,(char *)in_stack_fffffffffffff540,
             (allocator<char> *)in_stack_fffffffffffff538);
  local_448 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff510);
  local_420 = 0;
  uStack_418 = 0;
  local_410 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff4f8);
  local_408 = 0;
  local_407 = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff570,in_stack_fffffffffffff568,
                 (Type)((ulong)in_stack_fffffffffffff560 >> 0x20),
                 (Fallback *)CONCAT17(in_stack_fffffffffffff55f,in_stack_fffffffffffff558),
                 in_stack_fffffffffffff550,in_stack_fffffffffffff548);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff548,(char *)in_stack_fffffffffffff540,
             (allocator<char> *)in_stack_fffffffffffff538);
  local_8d1[1] = (allocator<char>)0x0;
  local_8d1[2] = (allocator<char>)0x0;
  local_8d1[3] = (allocator<char>)0x0;
  local_8d1[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff508,&in_stack_fffffffffffff500->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff548,(char *)in_stack_fffffffffffff540,
             (allocator<char> *)in_stack_fffffffffffff538);
  local_530 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff510);
  local_508 = 0;
  uStack_500 = 0;
  local_4f8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff4f8);
  local_4f0 = 0;
  local_4ef = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff570,in_stack_fffffffffffff568,
                 (Type)((ulong)in_stack_fffffffffffff560 >> 0x20),
                 (Fallback *)CONCAT17(in_stack_fffffffffffff55f,in_stack_fffffffffffff558),
                 in_stack_fffffffffffff550,in_stack_fffffffffffff548);
  this_00 = &local_150;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff548,(char *)in_stack_fffffffffffff540,
             (allocator<char> *)in_stack_fffffffffffff538);
  UniValue::UniValue<const_unsigned_long_&,_unsigned_long,_true>
            (in_stack_fffffffffffff538,(unsigned_long *)in_stack_fffffffffffff530);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff508,in_stack_fffffffffffff500);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff548,(char *)in_stack_fffffffffffff540,
             (allocator<char> *)in_stack_fffffffffffff538);
  local_670 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff510);
  local_648 = 0;
  uStack_640 = 0;
  local_638 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff4f8);
  local_630 = 0;
  local_62f = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff570,in_stack_fffffffffffff568,
                 (Type)((ulong)in_stack_fffffffffffff560 >> 0x20),
                 (Fallback *)CONCAT17(in_stack_fffffffffffff55f,in_stack_fffffffffffff558),
                 in_stack_fffffffffffff550,in_stack_fffffffffffff548);
  uVar5 = 0;
  std::allocator<RPCArg>::allocator((allocator<RPCArg> *)in_stack_fffffffffffff4f8);
  __l._M_len = (size_type)in_stack_fffffffffffff548;
  __l._M_array = in_stack_fffffffffffff540;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff538,__l,
             (allocator_type *)in_stack_fffffffffffff530);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff548,(char *)in_stack_fffffffffffff540,
             (allocator<char> *)in_stack_fffffffffffff538);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff548,(char *)in_stack_fffffffffffff540,
             (allocator<char> *)in_stack_fffffffffffff538);
  pRVar3 = local_7c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff548,(char *)in_stack_fffffffffffff540,
             (allocator<char> *)in_stack_fffffffffffff538);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff548,(char *)in_stack_fffffffffffff540,
             (allocator<char> *)in_stack_fffffffffffff538);
  local_938 = (pointer)0x0;
  pRStack_930 = (pointer)0x0;
  local_928 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff4f8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff580,(Type)((ulong)in_stack_fffffffffffff578 >> 0x20),
             &in_stack_fffffffffffff570->m_names,in_stack_fffffffffffff568,in_stack_fffffffffffff560
             ,(bool)in_stack_fffffffffffff55f);
  uVar4 = 0;
  args = local_7c0;
  description = (string *)0x1;
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff4f8);
  __l_00._M_len = (size_type)in_stack_fffffffffffff548;
  __l_00._M_array = (iterator)in_stack_fffffffffffff540;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff538,__l_00,
             (allocator_type *)in_stack_fffffffffffff530);
  RPCResult::RPCResult
            (in_stack_fffffffffffff580,(Type)((ulong)in_stack_fffffffffffff578 >> 0x20),
             &in_stack_fffffffffffff570->m_names,in_stack_fffffffffffff568,in_stack_fffffffffffff560
             ,(bool)in_stack_fffffffffffff55f);
  RPCResults::RPCResults(in_stack_fffffffffffff578,(RPCResult *)in_stack_fffffffffffff570);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff548,(char *)in_stack_fffffffffffff540,
             (allocator<char> *)in_stack_fffffffffffff538);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff548,(char *)in_stack_fffffffffffff540,
             (allocator<char> *)in_stack_fffffffffffff538);
  HelpExampleCli(in_stack_fffffffffffff530,in_stack_fffffffffffff528);
  std::operator+((char *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff4f8,(string *)0x61a7b6);
  this = (RPCArg *)&stack0xfffffffffffff6a0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<generatetodescriptor()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_fffffffffffff508,(anon_class_1_0_00000001 *)in_stack_fffffffffffff500);
  RPCHelpMan::RPCHelpMan
            (this_00,(string *)CONCAT17(uVar5,in_stack_fffffffffffff660),description,
             (vector<RPCArg,_std::allocator<RPCArg>_> *)args,pRVar3,
             (RPCExamples *)CONCAT17(uVar4,in_stack_fffffffffffff640),in_stack_fffffffffffff760);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_93b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_93a);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff508);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  pRVar3 = local_7c0;
  local_a78 = local_738;
  do {
    local_a78 = local_a78 + -0x11;
    RPCResult::~RPCResult((RPCResult *)this);
  } while ((RPCResults *)local_a78 != pRVar3);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff508);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_912);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_911);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_8f2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_8f1);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff508);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_360;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_8d3);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_8d2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_8d1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_8ca);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_8c9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_8c1);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_8a2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_8a1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan generatetodescriptor()
{
    return RPCHelpMan{
        "generatetodescriptor",
        "Mine to a specified descriptor and return the block hashes.",
        {
            {"num_blocks", RPCArg::Type::NUM, RPCArg::Optional::NO, "How many blocks are generated."},
            {"descriptor", RPCArg::Type::STR, RPCArg::Optional::NO, "The descriptor to send the newly generated bitcoin to."},
            {"maxtries", RPCArg::Type::NUM, RPCArg::Default{DEFAULT_MAX_TRIES}, "How many iterations to try."},
        },
        RPCResult{
            RPCResult::Type::ARR, "", "hashes of blocks generated",
            {
                {RPCResult::Type::STR_HEX, "", "blockhash"},
            }
        },
        RPCExamples{
            "\nGenerate 11 blocks to mydesc\n" + HelpExampleCli("generatetodescriptor", "11 \"mydesc\"")},
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const auto num_blocks{self.Arg<int>("num_blocks")};
    const auto max_tries{self.Arg<uint64_t>("maxtries")};

    CScript coinbase_script;
    std::string error;
    if (!getScriptFromDescriptor(self.Arg<std::string>("descriptor"), coinbase_script, error)) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, error);
    }

    NodeContext& node = EnsureAnyNodeContext(request.context);
    Mining& miner = EnsureMining(node);
    ChainstateManager& chainman = EnsureChainman(node);

    return generateBlocks(chainman, miner, coinbase_script, num_blocks, max_tries);
},
    };
}